

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O1

void nn_resp_loop(nn_options_t *options,int sock)

{
  uint uVar1;
  char *in_RAX;
  int *piVar2;
  void *buf;
  char *local_38;
  
  local_38 = in_RAX;
LAB_001040a5:
  uVar1 = nn_recv(sock,&local_38,0xffffffffffffffff,0);
  if ((int)uVar1 < 0) goto code_r0x001040bf;
  goto LAB_001040c9;
code_r0x001040bf:
  piVar2 = __errno_location();
  if (*piVar2 != 0xb) {
LAB_001040c9:
    nn_assert_errno(~uVar1 >> 0x1f,"Can\'t recv");
    nn_print_message(options,local_38,uVar1);
    nn_freemsg(local_38);
    uVar1 = nn_send(sock,(options->data_to_send).data,(long)(options->data_to_send).length);
    if ((int)uVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xb) {
        fwrite("Message not sent (EAGAIN)\n",0x1a,1,_stderr);
        goto LAB_001040a5;
      }
    }
    nn_assert_errno(~uVar1 >> 0x1f,"Can\'t send");
  }
  goto LAB_001040a5;
}

Assistant:

void nn_resp_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;

    for (;;) {
        rc = nn_recv (sock, &buf, NN_MSG, 0);
        if (rc < 0 && errno == EAGAIN) {
                continue;
        } else {
            nn_assert_errno (rc >= 0, "Can't recv");
        }
        nn_print_message (options, buf, rc);
        nn_freemsg (buf);
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
    }
}